

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_ab3c04::BacktraceData::Dump(Value *__return_storage_ptr__,BacktraceData *this)

{
  Value *pVVar1;
  BacktraceData *this_local;
  Value *backtraceGraph;
  
  Json::Value::Value(__return_storage_ptr__,nullValue);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::clear(&this->CommandMap);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::clear(&this->FileMap);
  std::
  unordered_map<const_cmListFileContext_*,_unsigned_int,_std::hash<const_cmListFileContext_*>,_std::equal_to<const_cmListFileContext_*>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>_>
  ::clear(&this->NodeMap);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"commands");
  Json::Value::operator=(pVVar1,&this->Commands);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"files");
  Json::Value::operator=(pVVar1,&this->Files);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"nodes");
  Json::Value::operator=(pVVar1,&this->Nodes);
  return __return_storage_ptr__;
}

Assistant:

Json::Value BacktraceData::Dump()
{
  Json::Value backtraceGraph;
  this->CommandMap.clear();
  this->FileMap.clear();
  this->NodeMap.clear();
  backtraceGraph["commands"] = std::move(this->Commands);
  backtraceGraph["files"] = std::move(this->Files);
  backtraceGraph["nodes"] = std::move(this->Nodes);
  return backtraceGraph;
}